

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_ctx_open(nng_ctx *cp,nng_socket s)

{
  int iVar1;
  uint32_t uVar2;
  nni_ctx *local_28;
  nni_ctx *ctx;
  nni_sock *sock;
  
  iVar1 = nni_sock_find((nni_sock **)&ctx,s.id);
  if (iVar1 == 0) {
    iVar1 = nni_ctx_open(&local_28,(nni_sock *)ctx);
    if (iVar1 == 0) {
      uVar2 = nni_ctx_id(local_28);
      nni_ctx_rele(local_28);
      nni_sock_rele((nni_sock *)ctx);
      cp->id = uVar2;
      iVar1 = 0;
    }
    else {
      nni_sock_rele((nni_sock *)ctx);
    }
  }
  return iVar1;
}

Assistant:

int
nng_ctx_open(nng_ctx *cp, nng_socket s)
{
	nni_sock *sock;
	nni_ctx  *ctx;
	int       rv;
	nng_ctx   c;

	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}
	if ((rv = nni_ctx_open(&ctx, sock)) != 0) {
		nni_sock_rele(sock);
		return (rv);
	}
	c.id = nni_ctx_id(ctx);
	nni_ctx_rele(ctx);
	nni_sock_rele(sock);
	*cp = c;
	return (0);
}